

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O1

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::WriteTypedArray
          (SerializationCloner<Js::StreamWriter> *this,SrcTypeId typeId,Src src)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  switch(typeId) {
  case TypeIds_Int8Array:
    break;
  case TypeIds_Uint8Array:
    if ((*src != VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_true>_>::Address) &&
       (*src != VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<unsigned_char,_false,_true>_>_>
                ::Address)) {
      WriteTypedArray<unsigned_char,false,false>(this,src);
      return;
    }
    WriteTypedArray<unsigned_char,false,true>(this,src);
    return;
  case TypeIds_Uint8ClampedArray:
    if ((*src != VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_true>_>::Address) &&
       (*src != VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<unsigned_char,_true,_true>_>_>::
                Address)) {
      WriteTypedArray<unsigned_char,true,false>(this,src);
      return;
    }
    WriteTypedArray<unsigned_char,true,true>(this,src);
    return;
  case TypeIds_Int16Array:
    if ((*src != VirtualTableInfo<Js::TypedArray<short,_false,_true>_>::Address) &&
       (*src != VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<short,_false,_true>_>_>::Address
       )) {
      WriteTypedArray<short,false,false>(this,src);
      return;
    }
    WriteTypedArray<short,false,true>(this,src);
    return;
  case TypeIds_Uint16Array:
    if ((*src != VirtualTableInfo<Js::TypedArray<unsigned_short,_false,_true>_>::Address) &&
       (*src != VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<unsigned_short,_false,_true>_>_>
                ::Address)) {
      WriteTypedArray<unsigned_short,false,false>(this,src);
      return;
    }
    WriteTypedArray<unsigned_short,false,true>(this,src);
    return;
  case TypeIds_Int32Array:
    if ((*src != VirtualTableInfo<Js::TypedArray<int,_false,_true>_>::Address) &&
       (*src != VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<int,_false,_true>_>_>::Address))
    {
      WriteTypedArray<int,false,false>(this,src);
      return;
    }
    WriteTypedArray<int,false,true>(this,src);
    return;
  case TypeIds_Uint32Array:
    if ((*src != VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_true>_>::Address) &&
       (*src != VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<unsigned_int,_false,_true>_>_>::
                Address)) {
      WriteTypedArray<unsigned_int,false,false>(this,src);
      return;
    }
    WriteTypedArray<unsigned_int,false,true>(this,src);
    return;
  case TypeIds_Float32Array:
    if ((*src != VirtualTableInfo<Js::TypedArray<float,_false,_true>_>::Address) &&
       (*src != VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<float,_false,_true>_>_>::Address
       )) {
      WriteTypedArray<float,false,false>(this,src);
      return;
    }
    WriteTypedArray<float,false,true>(this,src);
    return;
  case TypeIds_Float64Array:
    if ((*src != VirtualTableInfo<Js::TypedArray<double,_false,_true>_>::Address) &&
       (*src != VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<double,_false,_true>_>_>::
                Address)) {
      WriteTypedArray<double,false,false>(this,src);
      return;
    }
    WriteTypedArray<double,false,true>(this,src);
    return;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCASerialization.cpp"
                                ,0x202,"(false)","false");
    if (bVar2) {
      *puVar3 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case TypeIds_DataView:
    WriteTypedArray<Js::DataView,false,false>(this,src);
    return;
  }
  if ((*src != VirtualTableInfo<Js::TypedArray<char,_false,_true>_>::Address) &&
     (*src != VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<char,_false,_true>_>_>::Address))
  {
    WriteTypedArray<char,false,false>(this,src);
    return;
  }
  WriteTypedArray<char,false,true>(this,src);
  return;
}

Assistant:

void SerializationCloner<Writer>::WriteTypedArray(SrcTypeId typeId, Src src) const
    {
        switch (typeId)
        {
        case TypeIds_Int8Array:
            if (Int8VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<int8, false, true>(src);
            }
            else
            {
                WriteTypedArray<int8, false>(src);
            }
            break;

        case TypeIds_Uint8Array:
            if (Uint8VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<uint8, false, true>(src);
            }
            else
            {
                WriteTypedArray<uint8, false>(src);
            }
            break;

        case TypeIds_Uint8ClampedArray:
            if (Uint8ClampedVirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<uint8, true, true>(src);
            }
            else
            {
                WriteTypedArray<uint8, true>(src);
            }
            break;

        case TypeIds_Int16Array:
            if (Int16VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<int16, false, true>(src);
            }
            else
            {
                WriteTypedArray<int16, false>(src);
            }
            break;

        case TypeIds_Uint16Array:
            if (Uint16VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<uint16, false, true>(src);
            }
            else
            {
                WriteTypedArray<uint16, false>(src);
            }
            break;

        case TypeIds_Int32Array:
            if (Int32VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<int32, false, true>(src);
            }
            else
            {
                WriteTypedArray<int32, false>(src);
            }
            break;

        case TypeIds_Uint32Array:
            if (Uint32VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<uint32, false, true>(src);
            }
            else
            {
                WriteTypedArray<uint32, false>(src);
            }
            break;

        case TypeIds_Float32Array:
            if (Float32VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<float, false, true>(src);
            }
            else
            {
                WriteTypedArray<float, false>(src);
            }
            break;

        case TypeIds_Float64Array:
            if (Float64VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<double, false, true>(src);
            }
            else
            {
                WriteTypedArray<double, false>(src);
            }
            break;

        case TypeIds_DataView:
            WriteTypedArray<DataView, false>(src);
            break;

        default:
            Assert(false);
        }
    }